

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O2

ND_UINT8 ShemuX86CountZeroBits(ND_UINT64 Value,ND_OPERAND_SIZE Size,ND_BOOL Forward)

{
  ND_UINT8 NVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,Forward) == 0) {
    iVar2 = 0;
    while ((uVar4 = (Size * 8 - 1) + iVar2, -1 < (int)uVar4 &&
           ((Value >> ((ulong)uVar4 & 0x3f) & 1) == 0))) {
      iVar2 = iVar2 + -1;
    }
    NVar1 = -(char)iVar2;
  }
  else {
    NVar1 = (char)Size << 3;
    for (uVar3 = 0; Size * 8 != uVar3; uVar3 = uVar3 + 1) {
      if ((Value >> (uVar3 & 0x3f) & 1) != 0) {
        return (ND_UINT8)uVar3;
      }
    }
  }
  return NVar1;
}

Assistant:

static ND_UINT8
ShemuX86CountZeroBits(
    ND_UINT64 Value,
    ND_OPERAND_SIZE Size,
    ND_BOOL Forward
    )
{
    ND_UINT8 cnt = 0;

    if (Forward)
    {
        for (ND_UINT32 i = 0; i < Size * 8 && ND_GET_BIT(i, Value) == 0; i++, cnt++);
    }
    else
    {
        for (ND_SINT32 i = Size * 8 - 1; i >= 0 && ND_GET_BIT(i, Value) == 0; i--, cnt++);
    }

    return cnt;
}